

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.hxx
# Opt level: O0

Graph * __thiscall Graph::differentiate(Graph *this)

{
  Matrix local_110;
  Graph *local_10;
  Graph *this_local;
  
  local_10 = this;
  Matrix::transpose(&this->super_Matrix);
  Matrix::operator[](&local_110,&this->super_Matrix,1);
  Matrix::differentiate(&local_110);
  Matrix::~Matrix(&local_110);
  Matrix::transpose(&this->super_Matrix);
  return this;
}

Assistant:

Graph& differentiate() {
		transpose();
		operator[](1).differentiate();
		transpose();
		return *this;
	}